

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresultstore.cpp
# Opt level: O0

int __thiscall
QtPrivate::ResultStoreBase::addResults
          (ResultStoreBase *this,int index,void *results,int vectorSize,int totalCount)

{
  int in_ECX;
  ResultItem *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  ResultItem filteredAway;
  ResultItem filteredIn;
  ResultItem resultItem;
  undefined4 in_stack_ffffffffffffffb0;
  int index_00;
  int local_3c;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(byte *)(in_RDI + 0x18) & 1) == 0) || (in_ECX == in_R8D)) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    ResultItem::ResultItem((ResultItem *)&local_18,in_RDX,in_ECX);
    local_3c = insertResultItem((ResultStoreBase *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),
                                (int)((ulong)in_RDI >> 0x20),in_RDX);
  }
  else {
    if (0 < in_ECX) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      ResultItem::ResultItem((ResultItem *)&local_28,in_RDX,in_ECX);
      insertResultItem((ResultStoreBase *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),
                       (int)((ulong)in_RDI >> 0x20),in_RDX);
    }
    index_00 = (int)((ulong)in_RDI >> 0x20);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    ResultItem::ResultItem((ResultItem *)&local_38,(void *)0x0,in_R8D - in_ECX);
    local_3c = insertResultItem((ResultStoreBase *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),
                                index_00,in_RDX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_3c;
  }
  __stack_chk_fail();
}

Assistant:

int ResultStoreBase::addResults(int index, const void *results, int vectorSize, int totalCount)
{
    if (m_filterMode == false || vectorSize == totalCount) {
        Q_ASSERT(vectorSize != 0);
        ResultItem resultItem(results, vectorSize);
        return insertResultItem(index, resultItem);
    } else {
        if (vectorSize > 0) {
            ResultItem filteredIn(results, vectorSize);
            insertResultItem(index, filteredIn);
        }
        ResultItem filteredAway(nullptr, totalCount - vectorSize);
        return insertResultItem(index + vectorSize, filteredAway);
    }
}